

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_sum(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  Value *this_00;
  double dVar2;
  Value local_c0;
  undefined1 local_b0 [24];
  ValueDictIterator kv;
  ValueDict map;
  long i;
  ValueList list;
  double sum;
  String local_40;
  ValueType local_30;
  Value val;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  val.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"self");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  list.isTemp = false;
  list._9_7_ = 0;
  if (local_30 == List) {
    Value::GetList((Value *)&i);
    map._16_8_ = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&i);
    while (map._16_8_ = map._16_8_ + -1, -1 < (long)map._16_8_) {
      this_00 = List<MiniScript::Value>::operator[]((List<MiniScript::Value> *)&i,map._16_8_);
      dVar2 = Value::DoubleValue(this_00);
      list._8_8_ = dVar2 + (double)list._8_8_;
    }
    List<MiniScript::Value>::~List((List<MiniScript::Value> *)&i);
  }
  else if (local_30 == Map) {
    Value::GetDict((ValueDict *)&kv.entry,(Value *)&stack0xffffffffffffffd0);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::GetIterator
              ((DictIterator<MiniScript::Value,_MiniScript::Value> *)(local_b0 + 0x10),
               (Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&kv.entry
              );
    while (bVar1 = DictIterator<MiniScript::Value,_MiniScript::Value>::Done
                             ((DictIterator<MiniScript::Value,_MiniScript::Value> *)
                              (local_b0 + 0x10)), ((bVar1 ^ 0xffU) & 1) != 0) {
      DictIterator<MiniScript::Value,_MiniScript::Value>::Value
                ((DictIterator<MiniScript::Value,_MiniScript::Value> *)local_b0);
      dVar2 = Value::DoubleValue((Value *)local_b0);
      list._8_8_ = dVar2 + (double)list._8_8_;
      Value::~Value((Value *)local_b0);
      DictIterator<MiniScript::Value,_MiniScript::Value>::Next
                ((DictIterator<MiniScript::Value,_MiniScript::Value> *)(local_b0 + 0x10));
    }
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&kv.entry
              );
  }
  Value::Value(&local_c0,(double)list._8_8_);
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_c0,true);
  Value::~Value(&local_c0);
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_sum(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		double sum = 0;
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			for (long i=list.Count()-1; i>=0; i--) {
				sum += list[i].DoubleValue();
			}
		} else if (val.type == ValueType::Map) {
			ValueDict map = val.GetDict();
			for (ValueDictIterator kv = map.GetIterator(); !kv.Done(); kv.Next()) {
				sum += kv.Value().DoubleValue();
			}
		}
		return IntrinsicResult(sum);
	}